

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_geometry
          (NodeLoader *this,instance_geometry__AttributeData *attributeData)

{
  Node *pNVar1;
  _Elt_pointer ppNVar2;
  UniqueId *pUVar3;
  GeometryMaterialIdInfo *pGVar4;
  UniqueId instantiatedGeometryUniqueId;
  InstanceGeometry *instanceGeometry;
  UniqueId uniqueId;
  UniqueId local_48;
  InstanceGeometry *local_30;
  UniqueId local_28;
  
  ppNVar2 = (this->mNodeStack).c.
            super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppNVar2 ==
      (this->mNodeStack).c.super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppNVar2 = (this->mNodeStack).c.
              super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pNVar1 = ppNVar2[-1];
  pUVar3 = IFilePartLoader::createUniqueIdFromUrl
                     (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                       super_IFilePartLoader,&attributeData->url,GEOMETRY,false);
  local_48.mClassId = pUVar3->mClassId;
  local_48._4_4_ = *(undefined4 *)&pUVar3->field_0x4;
  local_48.mObjectId = pUVar3->mObjectId;
  local_48.mFileId = pUVar3->mFileId;
  pGVar4 = IFilePartLoader::getMeshMaterialIdInfo
                     (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                       super_IFilePartLoader);
  this->mCurrentMaterialInfo = pGVar4;
  IFilePartLoader::createUniqueId
            (&local_28,
             &((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             INSTANCE_GEOMETRY);
  local_30 = (InstanceGeometry *)operator_new(0x98);
  (local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437>.super_Object._vptr_Object =
       (_func_int **)&PTR__ObjectTemplate_009dc2c0;
  (local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437>.mUniqueId.mClassId = local_28.mClassId
  ;
  *(undefined4 *)
   &(local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).
    super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437>.mUniqueId.field_0x4 = local_28._4_4_
  ;
  (local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437>.mUniqueId.mObjectId =
       local_28.mObjectId;
  (local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437>.mUniqueId.mFileId = local_28.mFileId;
  (local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437>.super_Object._vptr_Object =
       (_func_int **)&PTR__InstanceBase_009dc288;
  (local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).mName._M_dataplus._M_p =
       (pointer)&(local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).mName.field_2
  ;
  (local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).mName._M_string_length = 0;
  (local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).mName.field_2._M_local_buf
  [0] = '\0';
  (local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).mInstanciatedObjectId.
  mClassId = local_48.mClassId;
  *(undefined4 *)
   &(local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).mInstanciatedObjectId.
    field_0x4 = local_48._4_4_;
  (local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).mInstanciatedObjectId.
  mObjectId = local_48.mObjectId;
  (local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).mInstanciatedObjectId.
  mFileId = local_48.mFileId;
  (local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437>.super_Object._vptr_Object =
       (_func_int **)&PTR__InstanceBindingBase_009dc208;
  (local_30->mMaterialBindings)._vptr_Array = (_func_int **)&PTR_releaseMemory_009dc2f0;
  (local_30->mMaterialBindings).mData = (MaterialBinding *)0x0;
  (local_30->mMaterialBindings).mCount = 0;
  *(undefined8 *)((long)&(local_30->mMaterialBindings).mCount + 4) = 0;
  *(undefined8 *)((long)&(local_30->mMaterialBindings).mCapacity + 4) = 0;
  (local_30->mSkeletons).super__Vector_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (local_30->mSkeletons).super__Vector_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_30->mSkeletons).super__Vector_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mCurrentInstanceGeometry = local_30;
  std::__cxx11::string::_M_assign
            ((string *)&(local_30->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>).mName)
  ;
  COLLADAFW::
  ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>_*>::
  append(&(pNVar1->mInstanceGeometries).
          super_ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>_*>
         ,&local_30);
  COLLADAFW::UniqueId::~UniqueId(&local_28);
  COLLADAFW::UniqueId::~UniqueId(&local_48);
  return true;
}

Assistant:

bool NodeLoader::begin__instance_geometry( const instance_geometry__AttributeData& attributeData )
	{
		COLLADAFW::Node* currentNode = mNodeStack.top();

		COLLADAFW::UniqueId instantiatedGeometryUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl( attributeData.url, COLLADAFW::Geometry::ID());
		mCurrentMaterialInfo = &getHandlingFilePartLoader()->getMeshMaterialIdInfo();

        COLLADAFW::UniqueId uniqueId = getHandlingFilePartLoader()->createUniqueId ( COLLADAFW::InstanceGeometry::ID() );
		COLLADAFW::InstanceGeometry* instanceGeometry = FW_NEW COLLADAFW::InstanceGeometry ( uniqueId, instantiatedGeometryUniqueId );
		mCurrentInstanceGeometry = instanceGeometry;
		instanceGeometry->setName(currentNode->getName());
		currentNode->getInstanceGeometries().append(instanceGeometry);

		return true;
	}